

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O1

void __thiscall
FastVector<unsigned_int,_false,_false>::grow_and_add
          (FastVector<unsigned_int,_false,_false> *this,uint newSize,uint *valPtr,uint elem)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  uint *puVar4;
  ulong uVar5;
  
  puVar3 = this->data;
  grow_no_destroy(this,newSize);
  if (elem != 0) {
    puVar4 = this->data;
    uVar5 = 0;
    do {
      uVar1 = valPtr[uVar5];
      uVar2 = this->count;
      this->count = uVar2 + 1;
      puVar4[uVar2] = uVar1;
      uVar5 = uVar5 + 1;
    } while (elem != uVar5);
  }
  if (puVar3 != (uint *)0x0) {
    (*(code *)NULLC::dealloc)(puVar3);
    return;
  }
  return;
}

Assistant:

void grow_and_add(unsigned newSize, const T* valPtr, unsigned elem)
	{
		T* oldData = data;
		unsigned oldMax = max;

		grow_no_destroy(newSize);

		for(unsigned i = 0; i < elem; i++)
			data[count++] = valPtr[i];

		if(oldData)
		{
			if(!skipConstructor)
				NULLC::destruct(oldData, oldMax);
			else
				NULLC::alignedDealloc(oldData);
		}
	}